

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O3

BOOL __thiscall
Js::ES5HeapArgumentsObject::SetAccessorsForFormal
          (ES5HeapArgumentsObject *this,uint32 index,PropertyId propertyId,Var getter,Var setter,
          PropertyOperationFlags flags)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  undefined1 local_50 [8];
  AutoObjectArrayItemExistsValidator autoItemAddRelease;
  
  autoItemAddRelease._8_8_ = setter;
  if (((*(uint *)&(this->super_HeapArgumentsObject).field_0x20 & 0x7fffffff) <= index) ||
     ((this->super_HeapArgumentsObject).formalCount <= index)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                ,0x308,"(this->IsFormalArgument(index))",
                                "SetAccessorsForFormal: called for non-formal");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  AutoObjectArrayItemExistsValidator::AutoObjectArrayItemExistsValidator
            ((AutoObjectArrayItemExistsValidator *)local_50,this,index);
  BVar3 = DynamicObject::SetAccessors
                    ((DynamicObject *)this,propertyId,getter,(Var)autoItemAddRelease._8_8_,flags);
  if (BVar3 != 0) {
    DisconnectFormalFromNamedArgument(this,index);
  }
  autoItemAddRelease.m_args._0_1_ = BVar3 == 0;
  AutoObjectArrayItemExistsValidator::~AutoObjectArrayItemExistsValidator
            ((AutoObjectArrayItemExistsValidator *)local_50);
  return BVar3;
}

Assistant:

BOOL ES5HeapArgumentsObject::SetAccessorsForFormal(uint32 index, PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        AssertMsg(this->IsFormalArgument(index), "SetAccessorsForFormal: called for non-formal");

        AutoObjectArrayItemExistsValidator autoItemAddRelease(this, index);

        BOOL result = this->DynamicObject::SetAccessors(propertyId, getter, setter, flags);
        if (result)
        {
            this->DisconnectFormalFromNamedArgument(index);
        }
        autoItemAddRelease.m_isReleaseItemNeeded = !result;

        return result;
    }